

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O2

_Bool dice_parse_string(dice_t *dice,char *string)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  dice_state_t dVar4;
  wchar_t wVar5;
  _Bool _Var12;
  size_t sVar6;
  ushort **ppuVar7;
  uchar *puVar8;
  long lVar9;
  dice_expression_entry_t *pdVar10;
  char *pcVar11;
  uint uVar13;
  dice_input_t input;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int iVar18;
  ulong local_60;
  char token [17];
  
  token[0] = '\0';
  token[1] = '\0';
  token[2] = '\0';
  token[3] = '\0';
  token[4] = '\0';
  token[5] = '\0';
  token[6] = '\0';
  token[7] = '\0';
  token[8] = '\0';
  token[9] = '\0';
  token[10] = '\0';
  token[0xb] = '\0';
  token[0xc] = '\0';
  token[0xd] = '\0';
  token[0xe] = '\0';
  token[0xf] = '\0';
  token[0x10] = '\0';
  uVar14 = 0;
  bVar17 = false;
  if (string != (char *)0x0 && dice != (dice_t *)0x0) {
    dice_reset(dice);
    local_60 = 0;
    uVar16 = 0;
    uVar13 = 0;
    while( true ) {
      sVar6 = strlen(string);
      bVar17 = sVar6 < uVar16;
      if (sVar6 < uVar16) break;
      ppuVar7 = __ctype_b_loc();
      cVar1 = string[uVar16];
      uVar2 = (*ppuVar7)[cVar1];
      if ((uVar2 >> 0xd & 1) != 0) goto switchD_001e73c1_caseD_3;
      input = DICE_INPUT_MINUS;
      switch(cVar1) {
      case '$':
        input = DICE_INPUT_VAR;
        break;
      case '%':
      case '\'':
      case '(':
      case ')':
      case '*':
      case ',':
switchD_001e72d8_caseD_25:
        input = DICE_INPUT_DIGIT;
        if (((uVar2 >> 0xb & 1) == 0) && (input = DICE_INPUT_UPPER, (uVar2 >> 8 & 1) == 0))
        goto LAB_001e7323;
      case '-':
        if (local_60 < 0x10) {
          token[local_60] = cVar1;
          local_60 = local_60 + 1;
        }
        break;
      case '&':
        input = DICE_INPUT_AMP;
        break;
      case '+':
        input = DICE_INPUT_BASE;
        break;
      default:
        if (cVar1 == '\0') {
          input = DICE_INPUT_NULL;
          break;
        }
        if (cVar1 != 'M') {
          if (cVar1 == 'd') {
            input = DICE_INPUT_DICE;
            break;
          }
          if (cVar1 != 'm') goto switchD_001e72d8_caseD_25;
        }
        goto LAB_001e7323;
      }
      dVar4 = dice_parse_state_transition((dice_state_t)uVar14,input);
      uVar14 = (ulong)dVar4;
LAB_001e7323:
      if (cVar1 == 'm') {
LAB_001e7367:
        if ((uint)uVar14 == 0xd) {
          return bVar17;
        }
        if ((0x179aUL >> (uVar14 & 0x3f) & 1) != 0) {
          return bVar17;
        }
        puVar8 = dice_parse_state_transition::state_table[uVar14] + 4;
LAB_001e7392:
        uVar14 = (ulong)(*puVar8 - 0x41);
      }
      else if (cVar1 == 'M') {
        if (((uint)uVar14 & 0xfffffffe) != 10) goto LAB_001e7367;
        if (local_60 < 0x10) {
          token[local_60] = 'M';
          local_60 = local_60 + 1;
        }
        puVar8 = dice_parse_state_transition::state_table[uVar14] + 7;
        goto LAB_001e7392;
      }
      if (0xc < (uint)uVar14) {
        return bVar17;
      }
      uVar3 = 1;
      switch((uint)uVar14) {
      case 2:
        break;
      default:
switchD_001e73c1_caseD_3:
        goto LAB_001e7506;
      case 4:
        uVar3 = 2;
        if (token[0] == '\0') {
          token[0] = '1';
          token[1] = '\0';
        }
        break;
      case 6:
        uVar3 = 3;
        break;
      case 7:
        uVar3 = (uVar13 != 2) + 3;
        break;
      case 9:
        uVar3 = 4;
        break;
      case 0xc:
        uVar3 = uVar13 + 1;
        if (3 < uVar13) {
          uVar3 = 4;
        }
      }
      uVar13 = uVar3;
      if ((long)token[0] != 0) {
        uVar2 = (*ppuVar7)[token[0]];
        if ((uVar2 & 0x100) == 0) {
          lVar9 = strtol(token,(char **)0x0,0);
        }
        else {
          if (dice->expressions == (dice_expression_entry_t *)0x0) {
            pdVar10 = (dice_expression_entry_t *)mem_zalloc(0x40);
            dice->expressions = pdVar10;
          }
          lVar15 = 0;
          for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
            pcVar11 = *(char **)((long)&dice->expressions->name + lVar15);
            if (pcVar11 == (char *)0x0) {
              pcVar11 = string_make(token);
              *(char **)((long)&dice->expressions->name + lVar15) = pcVar11;
              goto LAB_001e74a4;
            }
            wVar5 = my_stricmp(pcVar11,token);
            if (wVar5 == L'\0') goto LAB_001e74a4;
            lVar15 = lVar15 + 0x10;
          }
          lVar9 = 0xffffffff;
        }
LAB_001e74a4:
        iVar18 = (int)lVar9;
        _Var12 = SUB21((uVar2 & 0x100) >> 8,0);
        switch(uVar13) {
        case 1:
          dice->b = iVar18;
          dice->ex_b = _Var12;
          break;
        case 2:
          dice->x = iVar18;
          dice->ex_x = _Var12;
          break;
        case 3:
          dice->y = iVar18;
          dice->ex_y = _Var12;
          break;
        case 4:
          dice->m = iVar18;
          dice->ex_m = _Var12;
        }
        token[0] = '\0';
        token[1] = '\0';
        token[2] = '\0';
        token[3] = '\0';
        token[4] = '\0';
        token[5] = '\0';
        token[6] = '\0';
        token[7] = '\0';
        token[8] = '\0';
        token[9] = '\0';
        token[10] = '\0';
        token[0xb] = '\0';
        token[0xc] = '\0';
        token[0xd] = '\0';
        token[0xe] = '\0';
        token[0xf] = '\0';
        token[0x10] = '\0';
        local_60 = 0;
      }
LAB_001e7506:
      uVar16 = uVar16 + 1;
    }
  }
  return bVar17;
}

Assistant:

bool dice_parse_string(dice_t *dice, const char *string)
{
	char token[DICE_TOKEN_SIZE + 1] = { '\0' };
	size_t token_end = 0;
	size_t current = 0;
	dice_state_t state = 0;

	/* We need to keep track of the last thing we saw, since the parser isn't complex. */
	enum last_seen_e {
		DICE_SEEN_NONE,
		DICE_SEEN_BASE,
		DICE_SEEN_DICE,
		DICE_SEEN_SIDE,
		DICE_SEEN_BONUS,
	} last_seen = DICE_SEEN_NONE;

	if (dice == NULL || string == NULL)
		return false;

	/* Reset all internal state, since this object might be reused. */
	dice_reset(dice);

	/* Note that we are including the string terminator as part of the parse. */
	for (current = 0; current <= strlen(string); current++) {
		bool flush;
		dice_input_t input_type = DICE_INPUT_MAX;

		/* Skip spaces; this will concatenate digits and variable names. */
		if (isspace(string[current]))
			continue;

		input_type = dice_input_for_char(string[current]);

		/*
		 * Get the next state, based on the type of input char. If it's a
		 * possible number or varible name, we'll store the character in the
		 * token buffer.
		 */
		switch (input_type) {
			case DICE_INPUT_AMP:
			case DICE_INPUT_BASE:
			case DICE_INPUT_DICE:
			case DICE_INPUT_VAR:
			case DICE_INPUT_NULL:
				state = dice_parse_state_transition(state, input_type);
				break;

			case DICE_INPUT_MINUS:
			case DICE_INPUT_DIGIT:
			case DICE_INPUT_UPPER:
				/* Truncate tokens if they are too long to fit. */
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, input_type);
				break;

			default:
				break;
		}

		/*
		 * Allow 'M' to be used as the bonus marker and to be used in variable
		 * names.
		 * Ideally, 'm' should be the only marker and this could go away by
		 * adding a case to the switch above for DICE_INPUT_BONUS
		 * (underneath DICE_INPUT_NULL).
		 */
		if (string[current] == 'M') {
			if (state == DICE_STATE_VAR || state == DICE_STATE_VAR_CHAR) {
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, DICE_INPUT_UPPER);
			}
			else
				state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}
		else if (string[current] == 'm') {
			state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}

		/* Illegal transition. */
		if (state >= DICE_STATE_MAX)
			return false;

		/*
		 * Default flushing to true, since there are more states that don't
		 * need to be flushed. For some states, we need to do a bit of extra
		 * work, since the parser isn't that complex. A more complex parser
		 * would have more explicit states for variable names.
		 */
		flush = true;

		switch (state) {
			case DICE_STATE_FLUSH_BASE:
				last_seen = DICE_SEEN_BASE;
				break;

			case DICE_STATE_FLUSH_DICE:
				last_seen = DICE_SEEN_DICE;
				/* If we see a 'd' without a number before it, we assume it
				 * to be one die. */
				if (strlen(token) == 0) {
					token[0] = '1';
					token[1] = '\0';
				}
				break;

			case DICE_STATE_FLUSH_SIDE:
				last_seen = DICE_SEEN_SIDE;
				break;

			case DICE_STATE_FLUSH_BONUS:
				last_seen = DICE_SEEN_BONUS;
				break;

			case DICE_STATE_FLUSH_ALL:
				/* Flushing all means that we are flushing whatever comes after
				 * it was that we last saw. */
				if (last_seen < DICE_SEEN_BONUS)
					last_seen++;
				break;

			case DICE_STATE_BONUS:
				/* The bonus state is weird, so if we last saw dice, we're now
				 * seeing sides. */
				if (last_seen == DICE_SEEN_DICE)
					last_seen = DICE_SEEN_SIDE;
				else
					last_seen = DICE_SEEN_BONUS;
				break;

			default:
				/* We're in a state that shouldn't flush anything. */
				flush = false;
				break;
		}

		/*
		 * If we have a token that we need to flush, put it where it needs to
		 * go in the dice object. If the token is an uppercase letter, it's
		 * a variable and needs to go in the expression table. Otherwise, we
		 * try to parse it as a number, where it is set directly as a value.
		 */
		if (flush && strlen(token) > 0) {
			int value = 0;
			bool is_variable = false;

			if (isupper(token[0])) {
				value = dice_add_variable(dice, token);
				is_variable = true;
			}
			else {
				value = (int)strtol(token, NULL, 0);
				is_variable = false;
			}

			switch (last_seen) {
				case DICE_SEEN_BASE:
					dice->b = value;
					dice->ex_b = is_variable;
					break;
				case DICE_SEEN_DICE:
					dice->x = value;
					dice->ex_x = is_variable;
					break;
				case DICE_SEEN_SIDE:
					dice->y = value;
					dice->ex_y = is_variable;
					break;
				case DICE_SEEN_BONUS:
					dice->m = value;
					dice->ex_m = is_variable;
					break;
				default:
					break;
			}

			memset(token, 0, DICE_TOKEN_SIZE + 1);
			token_end = 0;
		}
	}

	return true;
}